

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_channel_id_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  SSL *ssl_00;
  bool bVar1;
  int iVar2;
  SSL *ssl;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs->config->channel_id_private);
  if (((bVar1) && (iVar2 = SSL_is_dtls(ssl_00), iVar2 == 0)) && (type != ssl_client_hello_outer)) {
    iVar2 = CBB_add_u16(out,0x7550);
    if ((iVar2 == 0) || (iVar2 = CBB_add_u16(out,0), iVar2 == 0)) {
      hs_local._7_1_ = false;
    }
    else {
      hs_local._7_1_ = true;
    }
  }
  else {
    hs_local._7_1_ = true;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_channel_id_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                           CBB *out_compressible,
                                           ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  if (!hs->config->channel_id_private || SSL_is_dtls(ssl) ||
      // Don't offer Channel ID in ClientHelloOuter. ClientHelloOuter handshakes
      // are not authenticated for the name that can learn the Channel ID.
      //
      // We could alternatively offer the extension but sign with a random key.
      // For other extensions, we try to align |ssl_client_hello_outer| and
      // |ssl_client_hello_unencrypted|, to improve the effectiveness of ECH
      // GREASE. However, Channel ID is deprecated and unlikely to be used with
      // ECH, so do the simplest thing.
      type == ssl_client_hello_outer) {
    return true;
  }

  if (!CBB_add_u16(out, TLSEXT_TYPE_channel_id) ||
      !CBB_add_u16(out, 0 /* length */)) {
    return false;
  }

  return true;
}